

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snprintf_support.c
# Opt level: O1

uint check_integer_format(char format)

{
  uint uVar1;
  
  uVar1 = 0;
  if ((byte)(format + 0x9dU) < 6) {
    uVar1 = (&DAT_001140d0)[(byte)(format + 0x9dU)];
  }
  return uVar1;
}

Assistant:

unsigned int
check_integer_format(const char format)
{
	unsigned int  retValue = 0; // default failure
	switch( format) {
		case FMT_CHAR  :
		case FMT_SHORT :
		case FMT_INT   :
			retValue = 1;
			break;
	}
	return retValue;
}